

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarketDataSnapshotFullRefresh.h
# Opt level: O0

MsgType * FIX44::MarketDataSnapshotFullRefresh::MsgType(void)

{
  MsgType *in_RDI;
  allocator<char> local_31;
  STRING local_30;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"W",&local_31);
  FIX::MsgType::MsgType(in_RDI,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return in_RDI;
}

Assistant:

static FIX::MsgType MsgType() { return FIX::MsgType("W"); }